

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *gt)

{
  string *str;
  char local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string dir;
  cmGeneratorTarget *gt_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  dir.field_2._8_8_ = gt;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum(&local_98,'/');
  (**(code **)(**(long **)(dir.field_2._8_8_ + 0x10) + 0x70))();
  local_b9 = '/';
  cmStrCat<std::__cxx11::string,char>((string *)local_38,&local_68,&local_98,&local_b8,&local_b9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::operator=((string *)(dir.field_2._8_8_ + 0x20),(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir =
    cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             gt->LocalGenerator->GetTargetDirectory(gt), '/');
  gt->ObjectDirectory = dir;
}